

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

void Bbr_bddImagePrintLatchDependency
               (DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *bVarsNs;
  DdNode *bVarsCs;
  int i;
  DdNode **pbVars_local;
  int nVars_local;
  DdNode **pbParts_local;
  int nParts_local;
  DdNode *bCare_local;
  DdManager *dd_local;
  
  n = Cudd_Support(dd,bCare);
  Cudd_Ref(n);
  n_00 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(n_00);
  printf("The latch dependency matrix:\n");
  printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",(ulong)(uint)nParts,
         (ulong)(uint)dd->size,(ulong)(uint)nVars);
  printf("     : ");
  for (bVarsCs._4_4_ = 0; bVarsCs._4_4_ < dd->size; bVarsCs._4_4_ = bVarsCs._4_4_ + 1) {
    printf("%d",(long)bVarsCs._4_4_ % 10 & 0xffffffff);
  }
  printf("\n");
  for (bVarsCs._4_4_ = 0; bVarsCs._4_4_ < nParts; bVarsCs._4_4_ = bVarsCs._4_4_ + 1) {
    Bbr_bddImagePrintLatchDependencyOne(dd,pbParts[bVarsCs._4_4_],n,n_00,bVarsCs._4_4_);
  }
  Bbr_bddImagePrintLatchDependencyOne(dd,bCare,n,n_00,nParts);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,n_00);
  return;
}

Assistant:

void Bbr_bddImagePrintLatchDependency( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars )   // the NS and parameter variables (not quantified!)
{
    int i;
    DdNode * bVarsCs, * bVarsNs;

    bVarsCs = Cudd_Support( dd, bCare );                       Cudd_Ref( bVarsCs );
    bVarsNs = Cudd_bddComputeCube( dd, pbVars, NULL, nVars );  Cudd_Ref( bVarsNs );

    printf( "The latch dependency matrix:\n" );
    printf( "Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",
        nParts, dd->size, nVars );
    printf( "     : " );
    for ( i = 0; i < dd->size; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );

    for ( i = 0; i < nParts; i++ )
        Bbr_bddImagePrintLatchDependencyOne( dd, pbParts[i], bVarsCs, bVarsNs, i );
    Bbr_bddImagePrintLatchDependencyOne( dd, bCare, bVarsCs, bVarsNs, nParts );

    Cudd_RecursiveDeref( dd, bVarsCs );
    Cudd_RecursiveDeref( dd, bVarsNs );
}